

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetWorldToScreenScale(ON_Viewport *this,ON_3dPoint world_point,double *scale)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  byte bVar4;
  double dVar5;
  ON_3dPoint CamLoc;
  ON_3dVector local_70;
  ON_3dPoint local_58;
  ON_3dVector local_40;
  
  if (scale != (double *)0x0) {
    *scale = 0.0;
  }
  dVar5 = -1.23432101234321e+308;
  if (this->m_projection == perspective_view) {
    bVar1 = ON_3dPoint::IsValid(&world_point);
    dVar5 = -1.23432101234321e+308;
    if (bVar1) {
      pdVar2 = ON_3dPoint::operator_cast_to_double_(&local_58);
      pdVar3 = ON_3dVector::operator_cast_to_double_(&local_70);
      if (pdVar2 != (double *)0x0) {
        *pdVar2 = (this->m_CamLoc).x;
        pdVar2[1] = (this->m_CamLoc).y;
        pdVar2[2] = (this->m_CamLoc).z;
      }
      if (pdVar3 != (double *)0x0) {
        *pdVar3 = (this->m_CamZ).x;
        pdVar3[1] = (this->m_CamZ).y;
        pdVar3[2] = (this->m_CamZ).z;
      }
      bVar4 = 0.0 < this->m_frus_near & this->m_bValidCamera;
      if (bVar4 == 1) {
        ON_3dPoint::operator-(&local_40,&local_58,&world_point);
        dVar5 = ON_3dVector::operator*(&local_70,&local_40);
        dVar5 = (double)(~-(ulong)(0.0 < dVar5) & 0xffe5f8bd9e331dd2 |
                        (ulong)dVar5 & -(ulong)(0.0 < dVar5));
      }
      else {
        dVar5 = -1.23432101234321e+308;
      }
      if (bVar4 == 0) {
        return false;
      }
    }
  }
  bVar1 = GetWorldToScreenScale(this,dVar5,scale);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetWorldToScreenScale(
  ON_3dPoint world_point,
  double* scale
  ) const
{
  double frustum_depth = ON_UNSET_VALUE;

  if (nullptr != scale)
    *scale = 0.0;

  if (IsPerspectiveProjection() && world_point.IsValid())
  {
    ON_3dPoint CamLoc;
    ON_3dVector CamZ;
    if (!GetCameraFrame(CamLoc, nullptr, nullptr, CamZ) || !(m_frus_near > 0.0))
      return false;
    frustum_depth = CamZ*(CamLoc - world_point);
    if (!(frustum_depth > 0.0))
      frustum_depth = ON_UNSET_VALUE;
  }

  return GetWorldToScreenScale(frustum_depth, scale);
}